

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall tchecker::syncprod::synchronizer_t::locations_edges_events(synchronizer_t *this)

{
  loc_id_t tgt;
  event_id_t event_id;
  state_t *psVar1;
  transition_t *ptVar2;
  pointer ptVar3;
  bool bVar4;
  process_id_t pid;
  _Elt_pointer piVar5;
  invalid_argument *this_00;
  overflow_error *this_01;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar6;
  char *__function;
  _Head_base<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_false>
  *p_Var7;
  pointer ptVar8;
  const_state_sptr_t src;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  v;
  string state_name;
  string event_name;
  stack<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>_>
  waiting;
  syncprod_t sp;
  const_state_sptr_t local_330;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  local_328;
  system_t *local_310;
  locs_t *local_308;
  undefined1 local_300 [36];
  loc_id_t local_2dc;
  events_t *local_2d8;
  undefined1 local_2d0 [24];
  pointer piStack_2b8;
  pointer local_2b0;
  pointer local_2a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  pStack_2a0;
  pointer local_278;
  pointer local_270;
  _Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
  local_268;
  syncprod_t local_210;
  
  pid = tchecker::system::processes_t::process_id
                  (&(this->_product).super_processes_t,&this->_process_name);
  local_268._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
  ::_M_initialize_map(&local_268,0);
  syncprod_t::syncprod_t(&local_210,&this->_system,NO_SHARING,10000,0x10000);
  local_328.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  syncprod_t::initial(&local_210,&local_328,1);
  ptVar3 = local_328.
           super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_310 = &this->_product;
  if (local_328.
      super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_328.
      super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var7 = &((local_328.
                super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Tuple_impl<0UL,_unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
              ).
              super__Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
              .
              super__Head_base<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_false>
    ;
    do {
      psVar1 = &((p_Var7->_M_head_impl)._t)->super_state_t;
      if (psVar1 == (state_t *)0x0) goto LAB_00161dff;
      namify_abi_cxx11_((string *)local_300,this,psVar1);
      bVar4 = tchecker::system::locs_t::is_location
                        (&(this->_product).super_locs_t,pid,(string *)local_300);
      if (!bVar4) {
        psVar1 = &((p_Var7->_M_head_impl)._t)->super_state_t;
        if (psVar1 == (state_t *)0x0) goto LAB_00161dff;
        attributes((attributes_t *)local_2d0,this,psVar1);
        tchecker::system::system_t::add_location
                  (local_310,pid,(string *)local_300,(attributes_t *)local_2d0);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                       *)local_2d0);
        std::
        deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
        ::push_back((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
                     *)&local_268,&p_Var7->_M_head_impl);
      }
      if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
        operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
      }
      ptVar8 = (pointer)(p_Var7 + 2);
      p_Var7 = p_Var7 + 3;
    } while (ptVar8 != ptVar3);
  }
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::_M_erase_at_end(&local_328,
                    local_328.
                    super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_268._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_308 = &(this->_product).super_locs_t;
    local_2d8 = &(this->_product).super_events_t;
    local_278 = (pointer)&(this->_product).super_events_t._events_index;
    do {
      piVar5 = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar5 = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_330._t = (make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL> *)0x0;
      psVar1 = &(piVar5[-1]._t)->super_state_t;
      if ((psVar1 != (state_t *)0x0) &&
         (pmVar6 = (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)
                   ((long)&((psVar1[-1]._vloc._t)->super_vloc_t).super_loc_array_t.super_vloc_base_t
                           .super_array_capacity_t<unsigned_int>._capacity + 1),
         psVar1[-1]._vloc._t = pmVar6,
         pmVar6 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0xfffffffffffffffe)) {
        this_01 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this_01,"reference counter overflow");
        __cxa_throw(this_01,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
      }
      local_330._t = (make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL> *)psVar1;
      std::
      deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
      ::pop_back((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
                  *)&local_268);
      if (&(local_330._t)->super_state_t == (state_t *)0x0) {
        __function = 
        "T &tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::syncprod::state_t>>::operator*() const [T = const tchecker::make_shared_t<tchecker::syncprod::state_t>]"
        ;
        goto LAB_00161e14;
      }
      namify_abi_cxx11_((string *)local_2d0,this,&(local_330._t)->super_state_t);
      tchecker::system::locs_t::location
                ((locs_t *)local_300,(process_id_t)local_308,(string *)(ulong)pid);
      local_2dc = *(loc_id_t *)(local_300._0_8_ + 4);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._8_8_);
      }
      if ((pointer)local_2d0._0_8_ != (pointer)(local_2d0 + 0x10)) {
        operator_delete((void *)local_2d0._0_8_,
                        (ulong)((long)(_Hash_node_base **)local_2d0._16_8_ + 1));
      }
      syncprod_t::next(&local_210,&local_330,&local_328,1);
      local_270 = local_328.
                  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_328.
          super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_328.
          super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var7 = &((local_328.
                    super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Tuple_impl<0UL,_unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
                  ).
                  super__Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
                  .
                  super__Head_base<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_false>
        ;
        do {
          psVar1 = &((p_Var7->_M_head_impl)._t)->super_state_t;
          if (psVar1 == (state_t *)0x0) goto LAB_00161dff;
          namify_abi_cxx11_((string *)local_300,this,psVar1);
          bVar4 = tchecker::system::locs_t::is_location(local_308,pid,(string *)local_300);
          if (!bVar4) {
            psVar1 = &((p_Var7->_M_head_impl)._t)->super_state_t;
            if (psVar1 == (state_t *)0x0) goto LAB_00161dff;
            attributes((attributes_t *)local_2d0,this,psVar1);
            tchecker::system::system_t::add_location
                      (local_310,pid,(string *)local_300,(attributes_t *)local_2d0);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                           *)local_2d0);
            std::
            deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
            ::push_back((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
                         *)&local_268,&p_Var7->_M_head_impl);
          }
          tchecker::system::locs_t::location
                    ((locs_t *)local_2d0,(process_id_t)local_308,(string *)(ulong)pid);
          tgt = *(loc_id_t *)
                 ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2d0._0_8_)->_M_dataplus)._M_p + 4);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
          }
          ptVar2 = &((((_Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
                        *)(p_Var7 + -1))->
                     super__Tuple_impl<2UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
                     ).
                     super__Head_base<2UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_false>
                     ._M_head_impl._t)->super_transition_t;
          if (ptVar2 == (transition_t *)0x0) {
LAB_00161de8:
            __function = 
            "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::syncprod::transition_t>]"
            ;
            goto LAB_00161e14;
          }
          namify_abi_cxx11_((string *)(local_2d0 + 0x38),this,ptVar2);
          bVar4 = tchecker::system::events_t::is_event(local_2d8,(string *)(local_2d0 + 0x38));
          if (!bVar4) {
            local_2d0._0_8_ = local_2d0 + 0x30;
            local_2d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
            local_2d0._16_8_ = (_Hash_node_base *)0x0;
            piStack_2b8 = (pointer)0x0;
            local_2b0 = (pointer)0x3f800000;
            local_2a8 = (pointer)0x0;
            pStack_2a0.first._M_dataplus._M_p = (pointer)0x0;
            tchecker::system::events_t::add_event
                      (local_2d8,(string *)(local_2d0 + 0x38),(attributes_t *)local_2d0);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                           *)local_2d0);
          }
          boost::container::dtl::
          flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)local_2d0,(key_type *)local_278);
          if ((pointer)local_2d0._0_8_ ==
              (this->_product).super_events_t._events_index._key_map.m_flat_tree.m_data.m_seq.
              m_holder.m_start +
              *(stored_size_type *)
               ((long)&(this->_product).super_events_t._events_index._key_map.m_flat_tree.m_data.
                       m_seq + 8)) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this_00,"key is not indexed");
            __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          ptVar2 = &((((_Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
                        *)(p_Var7 + -1))->
                     super__Tuple_impl<2UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
                     ).
                     super__Head_base<2UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_false>
                     ._M_head_impl._t)->super_transition_t;
          if (ptVar2 == (transition_t *)0x0) goto LAB_00161de8;
          event_id = *(event_id_t *)(local_2d0._0_8_ + 0x20);
          attributes((attributes_t *)local_2d0,this,ptVar2);
          tchecker::system::system_t::add_edge
                    (local_310,pid,local_2dc,tgt,event_id,(attributes_t *)local_2d0);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                         *)local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pStack_2a0.first._M_string_length !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)pStack_2a0.first.field_2._M_local_buf + 8U)) {
            operator_delete((void *)pStack_2a0.first._M_string_length,
                            (ulong)(pStack_2a0.first.field_2._8_8_ + 1));
          }
          if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
            operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
          }
          ptVar8 = (pointer)(p_Var7 + 2);
          p_Var7 = p_Var7 + 3;
        } while (ptVar8 != local_270);
      }
      std::
      vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
      ::_M_erase_at_end(&local_328,
                        local_328.
                        super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_330);
    } while (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_268._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::~vector(&local_328);
  syncprod_t::~syncprod_t(&local_210);
  std::
  deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
  ::~deque((deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>_>_>
            *)&local_268);
  return;
LAB_00161dff:
  __function = 
  "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::syncprod::state_t>]"
  ;
LAB_00161e14:
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,__function);
}

Assistant:

void locations_edges_events()
  {
    std::size_t const block_size = 10000;
    std::size_t const table_size = 65536;

    tchecker::process_id_t pid = _product.process_id(_process_name);

    std::stack<tchecker::syncprod::state_sptr_t> waiting;
    tchecker::syncprod::syncprod_t sp(_system, tchecker::ts::NO_SHARING, block_size, table_size);
    std::vector<tchecker::syncprod::syncprod_t::sst_t> v;

    sp.initial(v);
    for (auto && [status, state, transition] : v) {
      std::string state_name = namify(*state);
      if (!_product.is_location(pid, state_name)) {
        _product.add_location(pid, state_name, attributes(*state));
        waiting.push(state);
      }
    }
    v.clear();

    while (!waiting.empty()) {
      tchecker::syncprod::const_state_sptr_t src = static_cast<tchecker::syncprod::const_state_sptr_t>(waiting.top());
      waiting.pop();

      tchecker::loc_id_t src_id = _product.location(pid, namify(*src))->id();

      sp.next(src, v);
      for (auto && [status, tgt, transition] : v) {
        std::string tgt_name = namify(*tgt);
        if (!_product.is_location(pid, tgt_name)) {
          _product.add_location(pid, tgt_name, attributes(*tgt));
          waiting.push(tgt);
        }
        tchecker::loc_id_t tgt_id = _product.location(pid, tgt_name)->id();

        std::string event_name = namify(*transition);
        if (!_product.is_event(event_name))
          _product.add_event(event_name);
        tchecker::event_id_t event_id = _product.event_id(event_name);

        _product.add_edge(pid, src_id, tgt_id, event_id, attributes(*transition));
      }
      v.clear();
    }
  }